

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_deserialize_struct
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,string *prefix,bool pointer)

{
  pointer pptVar1;
  ostream *poVar2;
  undefined7 in_register_00000081;
  pointer pptVar3;
  string local_70;
  string local_50;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  if ((int)CONCAT71(in_register_00000081,pointer) != 0) {
    poVar2 = std::operator<<(poVar2,"if (!");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,") { ");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"  ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2," = ::std::shared_ptr<");
    type_name_abi_cxx11_(&local_50,this,&tstruct->super_t_type,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,">(new ");
    type_name_abi_cxx11_(&local_70,this,&tstruct->super_t_type,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"xfer += ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,"->read(iprot);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"bool wasSet = false;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    while( true ) {
      pptVar1 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      poVar2 = t_generator::indent((t_generator *)this,out);
      if (pptVar3 == pptVar1) break;
      poVar2 = std::operator<<(poVar2,"if (");
      poVar2 = std::operator<<(poVar2,(string *)prefix);
      poVar2 = std::operator<<(poVar2,"->__isset.");
      poVar2 = std::operator<<(poVar2,(string *)&(*pptVar3)->name_);
      poVar2 = std::operator<<(poVar2,") { wasSet = true; }");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      pptVar3 = pptVar3 + 1;
    }
    poVar2 = std::operator<<(poVar2,"if (!wasSet) { ");
    poVar2 = std::operator<<(poVar2,(string *)prefix);
    poVar2 = std::operator<<(poVar2,".reset(); }");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    return;
  }
  poVar2 = std::operator<<(poVar2,"xfer += ");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".read(iprot);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  string prefix,
                                                  bool pointer) {
  if (pointer) {
    indent(out) << "if (!" << prefix << ") { " << endl;
    indent(out) << "  " << prefix << " = ::std::shared_ptr<" << type_name(tstruct) << ">(new "
                << type_name(tstruct) << ");" << endl;
    indent(out) << "}" << endl;
    indent(out) << "xfer += " << prefix << "->read(iprot);" << endl;
    indent(out) << "bool wasSet = false;" << endl;
    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;
    for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {

      indent(out) << "if (" << prefix << "->__isset." << (*f_iter)->get_name()
                  << ") { wasSet = true; }" << endl;
    }
    indent(out) << "if (!wasSet) { " << prefix << ".reset(); }" << endl;
  } else {
    indent(out) << "xfer += " << prefix << ".read(iprot);" << endl;
  }
}